

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmGetProjectName(void *arg)

{
  int iVar1;
  char *pcVar2;
  cmStateSnapshot local_50;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf;
  void *arg_local;
  
  local_18 = (cmMakefile *)arg;
  mf = (cmMakefile *)arg;
  if (cmGetProjectName(void*)::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&cmGetProjectName(void*)::name_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&cmGetProjectName(void*)::name_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&cmGetProjectName(void*)::name_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&cmGetProjectName(void*)::name_abi_cxx11_);
    }
  }
  cmMakefile::GetStateSnapshot(&local_50,local_18);
  cmStateSnapshot::GetProjectName_abi_cxx11_(&local_38,&local_50);
  std::__cxx11::string::operator=
            ((string *)&cmGetProjectName(void*)::name_abi_cxx11_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

static const char* CCONV cmGetProjectName(void* arg)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  static std::string name;
  name = mf->GetStateSnapshot().GetProjectName();
  return name.c_str();
}